

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void conv_decode_print_iter(correct_convolutional *conv,uint iter,uint winner_index)

{
  distance_t *pdVar1;
  uint j;
  ulong uVar2;
  shift_register_t i;
  ulong uVar3;
  shift_register_t i_1;
  
  if (iter < 0x8ac) {
    return;
  }
  printf("iteration: %d\n");
  pdVar1 = conv->errors->write_errors;
  puts("errors:");
  for (uVar3 = 0; uVar3 < conv->numstates >> 1; uVar3 = uVar3 + 1) {
    printf("%2d: %d\n",uVar3 & 0xffffffff,(ulong)pdVar1[uVar3]);
  }
  putchar(10);
  puts("history:");
  for (uVar3 = 0; uVar3 < conv->numstates >> 1; uVar3 = uVar3 + 1) {
    printf("%2d: ",uVar3 & 0xffffffff);
    for (uVar2 = 0; (uint)uVar2 <= winner_index; uVar2 = (ulong)((uint)uVar2 + 1)) {
      printf("%d",(ulong)(conv->history_buffer->history[uVar2][uVar3] != '\0'));
    }
    putchar(10);
  }
  putchar(10);
  return;
}

Assistant:

void conv_decode_print_iter(correct_convolutional *conv, unsigned int iter,
                            unsigned int winner_index) {
    if (iter < 2220) {
        return;
    }
    printf("iteration: %d\n", iter);
    distance_t *errors = conv->errors->write_errors;
    printf("errors:\n");
    for (shift_register_t i = 0; i < conv->numstates / 2; i++) {
        printf("%2d: %d\n", i, errors[i]);
    }
    printf("\n");
    printf("history:\n");
    for (shift_register_t i = 0; i < conv->numstates / 2; i++) {
        printf("%2d: ", i);
        for (unsigned int j = 0; j <= winner_index; j++) {
            printf("%d", conv->history_buffer->history[j][i] ? 1 : 0);
        }
        printf("\n");
    }
    printf("\n");
}